

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O1

uint64_t basisu::color_cell_compression
                   (uint32_t mode,color_cell_compressor_params *pParams,
                   color_cell_compressor_results *pResults,
                   bc7enc_compress_block_params *pComp_params)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  color_quad_u8 *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  color_quad_u8 cVar14;
  int iVar15;
  color_quad_u8 *pcVar16;
  int iVar17;
  uint64_t uVar18;
  uint uVar19;
  uint uVar20;
  char cVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  bool bVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [12];
  float fVar55;
  undefined1 auVar52 [16];
  float fVar54;
  undefined1 auVar53 [16];
  float __tmp;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float __tmp_1;
  float fVar60;
  undefined4 uVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined4 uVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined4 uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar90;
  float fVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar92;
  undefined1 auVar93 [16];
  bc7enc_vec4F xl;
  bc7enc_vec4F xl_00;
  bc7enc_vec4F xl_01;
  bc7enc_vec4F xl_02;
  bc7enc_vec4F xl_03;
  bc7enc_vec4F xl_04;
  bc7enc_vec4F xh;
  bc7enc_vec4F xh_00;
  bc7enc_vec4F xh_01;
  bc7enc_vec4F xh_02;
  bc7enc_vec4F xh_03;
  bc7enc_vec4F xh_04;
  uint32_t cb;
  uint32_t cg;
  uint32_t cr;
  uint8_t selectors_temp1 [16];
  uint8_t selectors_temp [16];
  float local_168;
  float local_164;
  float local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint32_t local_150;
  float local_14c;
  bc7enc_vec4F local_148;
  bc7enc_vec4F local_138;
  bc7enc_vec4F local_128;
  bc7enc_compress_block_params *local_110;
  undefined1 local_108 [16];
  color_cell_compressor_results local_f8;
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_150 = mode;
  local_110 = pComp_params;
  if (((mode != 6) && (pParams->m_astc_endpoint_range == 0)) && (pParams->m_has_alpha != '\0')) {
    __assert_fail("(mode == 6) || (!pParams->m_has_alpha)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x55e,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (0x1f < pParams->m_num_selector_weights - 1) {
    __assert_fail("pParams->m_num_selector_weights >= 1 && pParams->m_num_selector_weights <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x560,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (*pParams->m_pSelector_weights != 0) {
    __assert_fail("pParams->m_pSelector_weights[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x561,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (pParams->m_pSelector_weights[(ulong)pParams->m_num_selector_weights - 1] != 0x40) {
    __assert_fail("pParams->m_pSelector_weights[pParams->m_num_selector_weights - 1] == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x562,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  pResults->m_best_overall_err = 0xffffffffffffffff;
  if (pParams->m_pForce_selectors == (uint8_t *)0x0) {
    if (mode == 1) {
      bVar29 = is_solid_rgb(pParams,&local_154,&local_158,&local_15c);
      if (bVar29) {
        uVar18 = pack_mode1_to_one_color
                           (pParams,pResults,local_154,local_158,local_15c,pResults->m_pSelectors);
        return uVar18;
      }
    }
    else {
      uVar3 = pParams->m_astc_endpoint_range;
      if (((uVar3 == 8) && (pParams->m_num_selector_weights == 8)) && (pParams->m_has_alpha == '\0')
         ) {
        bVar29 = is_solid_rgb(pParams,&local_154,&local_158,&local_15c);
        if (bVar29) {
          uVar18 = pack_astc_4bit_3bit_to_one_color
                             (pParams,pResults,local_154,local_158,local_15c,pResults->m_pSelectors)
          ;
          return uVar18;
        }
      }
      else if (((uVar3 == 7) && (pParams->m_num_selector_weights == 4)) &&
              (pParams->m_has_alpha == '\0')) {
        bVar29 = is_solid_rgb(pParams,&local_154,&local_158,&local_15c);
        if (bVar29) {
          uVar18 = pack_astc_range7_2bit_to_one_color
                             (pParams,pResults,local_154,local_158,local_15c,pResults->m_pSelectors)
          ;
          return uVar18;
        }
      }
      else if (((uVar3 == 8) && (pParams->m_num_selector_weights == 4)) &&
              (pParams->m_has_alpha != '\0')) {
        pcVar4 = pParams->m_pPixels;
        bVar2 = pcVar4->m_c[0];
        local_154 = (uint)bVar2;
        bVar1 = pcVar4->m_c[1];
        local_158 = (uint)bVar1;
        local_15c = (uint)pcVar4->m_c[2];
        uVar28 = (ulong)pParams->m_num_pixels;
        bVar29 = uVar28 < 2;
        if (!bVar29) {
          if ((bVar2 != pcVar4[1].m_c[0]) || (bVar1 != pcVar4[1].m_c[1])) goto LAB_0020d916;
          bVar29 = false;
          uVar22 = 2;
          while (((pcVar4->m_c[2] == pcVar4[uVar22 - 1].m_c[2] &&
                  (pcVar4->m_c[3] == pcVar4[uVar22 - 1].m_c[3])) &&
                 (bVar29 = uVar28 <= uVar22, uVar22 != uVar28))) {
            if ((bVar2 != pcVar4[uVar22].m_c[0]) ||
               (pcVar16 = pcVar4 + uVar22, uVar22 = uVar22 + 1, bVar1 != pcVar16->m_c[1])) break;
          }
        }
        if (bVar29) {
          uVar18 = pack_astc_4bit_2bit_to_one_color_rgba
                             (pParams,pResults,local_154,local_158,local_15c,(uint)pcVar4->m_c[3],
                              pResults->m_pSelectors);
          return uVar18;
        }
      }
      else if (uVar3 == 0xb) {
        if (((pParams->m_num_selector_weights == 0x20) && (pParams->m_has_alpha == '\0')) &&
           (bVar29 = is_solid_rgb(pParams,&local_154,&local_158,&local_15c), bVar29)) {
          uVar18 = pack_astc_range11_5bit_to_one_color
                             (pParams,pResults,local_154,local_158,local_15c,pResults->m_pSelectors)
          ;
          return uVar18;
        }
      }
      else if (((uVar3 == 0xd) && (pParams->m_num_selector_weights == 4)) &&
              ((pParams->m_has_alpha == '\0' &&
               (bVar29 = is_solid_rgb(pParams,&local_154,&local_158,&local_15c), bVar29)))) {
        uVar18 = pack_astc_range13_2bit_to_one_color
                           (pParams,pResults,local_154,local_158,local_15c,pResults->m_pSelectors);
        return uVar18;
      }
    }
  }
LAB_0020d916:
  uVar28 = (ulong)pParams->m_num_pixels;
  if (uVar28 == 0) {
    fVar75 = 0.0;
    fVar76 = 0.0;
    fVar77 = 0.0;
    fVar78 = 0.0;
    fVar71 = 0.0;
    fVar72 = 0.0;
    fVar73 = 0.0;
    fVar74 = 0.0;
  }
  else {
    fVar71 = 0.0;
    fVar72 = 0.0;
    fVar73 = 0.0;
    fVar74 = 0.0;
    uVar22 = 0;
    fVar75 = 0.0;
    fVar76 = 0.0;
    fVar77 = 0.0;
    fVar78 = 0.0;
    do {
      auVar31 = ZEXT216(*(ushort *)pParams->m_pPixels[uVar22].m_c);
      auVar31 = pmovzxbd(auVar31,auVar31);
      fVar75 = fVar75 + (float)auVar31._0_4_;
      fVar76 = fVar76 + (float)auVar31._4_4_;
      fVar77 = fVar77 + (float)auVar31._8_4_;
      fVar78 = fVar78 + (float)auVar31._12_4_;
      auVar31 = ZEXT216(*(ushort *)(pParams->m_pPixels[uVar22].m_c + 2));
      auVar31 = pmovzxbd(auVar31,auVar31);
      fVar71 = fVar71 + (float)auVar31._0_4_;
      fVar72 = fVar72 + (float)auVar31._4_4_;
      fVar73 = fVar73 + (float)auVar31._8_4_;
      fVar74 = fVar74 + (float)auVar31._12_4_;
      uVar22 = uVar22 + 1;
    } while (uVar28 != uVar22);
  }
  fVar49 = 1.0 / ((float)uVar28 * 255.0);
  fVar44 = fVar75 * fVar49;
  fVar59 = fVar76 * fVar49;
  local_160 = 0.0;
  local_168 = 0.0;
  if ((0.0 <= fVar44) && (local_168 = fVar44, 1.0 < fVar44)) {
    local_168 = 1.0;
  }
  fVar44 = fVar71 * fVar49;
  if ((0.0 <= fVar59) && (local_160 = fVar59, 1.0 < fVar59)) {
    local_160 = 1.0;
  }
  fVar59 = 1.0 / (float)uVar28;
  fVar49 = fVar72 * fVar49;
  auVar31._0_12_ = ZEXT812(0);
  auVar31._12_4_ = 0;
  local_14c = 0.0;
  local_164 = 0.0;
  if ((0.0 <= fVar44) && (local_164 = fVar44, 1.0 < fVar44)) {
    local_164 = 1.0;
  }
  if ((0.0 <= fVar49) && (local_14c = fVar49, 1.0 < fVar49)) {
    local_14c = 1.0;
  }
  fVar75 = fVar75 * fVar59;
  fVar76 = fVar76 * fVar59;
  fVar77 = fVar77 * 0.0;
  fVar78 = fVar78 * 0.0;
  fVar71 = fVar71 * fVar59;
  fVar72 = fVar72 * fVar59;
  fVar73 = fVar73 * 0.0;
  fVar74 = fVar74 * 0.0;
  if (pParams->m_has_alpha == '\0') {
    if (uVar28 == 0) {
      auVar36 = ZEXT816(0);
      fVar44 = 0.0;
      fVar49 = 0.0;
      fVar59 = 0.0;
      fVar60 = 0.0;
      fVar62 = 0.0;
      fVar64 = 0.0;
    }
    else {
      uVar22 = 0;
      fVar59 = 0.0;
      fVar60 = 0.0;
      fVar62 = 0.0;
      fVar64 = 0.0;
      fVar44 = 0.0;
      fVar66 = 0.0;
      fVar49 = 0.0;
      fVar68 = 0.0;
      auVar31 = ZEXT816(0);
      do {
        auVar36 = ZEXT216(*(ushort *)pParams->m_pPixels[uVar22].m_c);
        auVar36 = pmovzxbd(auVar36,auVar36);
        fVar56 = (float)pParams->m_pPixels[uVar22].m_c[2] - fVar71;
        auVar32._0_4_ = (float)auVar36._0_4_ - fVar75;
        auVar32._4_4_ = (float)auVar36._4_4_ - fVar76;
        auVar32._8_4_ = (float)auVar36._8_4_ - fVar77;
        auVar32._12_4_ = (float)auVar36._12_4_ - fVar78;
        fVar59 = fVar59 + auVar32._0_4_ * auVar32._0_4_;
        fVar60 = fVar60 + auVar32._4_4_ * auVar32._4_4_;
        fVar62 = fVar62 + auVar32._8_4_ * auVar32._8_4_;
        fVar64 = fVar64 + auVar32._12_4_ * auVar32._12_4_;
        auVar36._0_4_ = auVar31._0_4_ + fVar56 * auVar32._0_4_;
        auVar36._4_4_ = auVar31._4_4_ + fVar56 * auVar32._4_4_;
        auVar36._8_4_ = auVar31._8_4_ + auVar32._8_4_ * 0.0;
        auVar36._12_4_ = auVar31._12_4_ + auVar32._12_4_ * 0.0;
        auVar33._4_4_ = auVar32._4_4_;
        auVar33._0_4_ = auVar32._4_4_;
        auVar33._8_4_ = auVar32._12_4_;
        auVar33._12_4_ = auVar32._12_4_;
        auVar31 = insertps(auVar32,ZEXT416((uint)fVar56),0x10);
        auVar32 = insertps(auVar33,ZEXT416((uint)fVar56),0x10);
        fVar44 = fVar44 + auVar32._0_4_ * auVar31._0_4_;
        fVar66 = fVar66 + auVar32._4_4_ * auVar31._4_4_;
        fVar49 = fVar49 + auVar32._8_4_ * auVar31._8_4_;
        fVar68 = fVar68 + auVar32._12_4_ * auVar31._12_4_;
        uVar22 = uVar22 + 1;
        auVar31 = auVar36;
      } while (uVar28 != uVar22);
      auVar31._4_4_ = fVar66;
      auVar31._0_4_ = fVar66;
      auVar31._8_4_ = fVar68;
      auVar31._12_4_ = fVar68;
    }
    auVar32 = blendps(auVar31,auVar36,0xe);
    auVar31 = ZEXT816(0x3f8000003f666666);
    auVar86._0_12_ = ZEXT812(0x3f333333);
    auVar86._12_4_ = 0;
    iVar17 = 3;
    do {
      fVar56 = auVar31._0_4_;
      auVar93._0_4_ = auVar86._0_4_ * auVar36._0_4_ + fVar44 * auVar31._4_4_ + fVar59 * fVar56;
      auVar93._4_4_ = auVar86._0_4_ * auVar36._4_4_ + fVar44 * fVar56 + fVar60 * auVar31._4_4_;
      auVar93._8_4_ =
           auVar86._8_4_ * auVar36._8_4_ + fVar49 * auVar31._8_4_ + fVar62 * auVar31._8_4_;
      auVar93._12_4_ =
           auVar86._8_4_ * auVar36._12_4_ + fVar49 * auVar31._12_4_ + fVar64 * auVar31._12_4_;
      auVar31 = blendps(auVar86,auVar31,0xe);
      fVar66 = auVar31._4_4_ * auVar32._4_4_;
      fVar68 = auVar31._12_4_ * auVar32._12_4_;
      auVar85._4_4_ = fVar66;
      auVar85._0_4_ = fVar66;
      auVar85._8_4_ = fVar68;
      auVar85._12_4_ = fVar68;
      auVar86._4_12_ = auVar85._4_12_;
      fVar68 = fVar66 + fVar56 * auVar36._0_4_ + auVar31._0_4_ * auVar32._0_4_;
      fVar66 = ABS(auVar93._0_4_);
      if (ABS(auVar93._0_4_) <= ABS(auVar93._4_4_)) {
        fVar66 = ABS(auVar93._4_4_);
      }
      if (fVar66 <= ABS(fVar68)) {
        fVar66 = ABS(fVar68);
      }
      fVar56 = 1.0 / fVar66;
      if (1e-10 < fVar66) {
        fVar68 = fVar68 * fVar56;
      }
      auVar86._0_4_ = fVar68;
      auVar37._0_4_ = (uint)(1e-10 < fVar66) << 0x1f;
      auVar37._4_4_ = (uint)(1e-10 < fVar66) << 0x1f;
      auVar37._8_8_ = 0;
      auVar10._4_4_ = fVar56 * auVar93._4_4_;
      auVar10._0_4_ = fVar56 * auVar93._0_4_;
      auVar10._8_4_ = auVar93._8_4_ * 0.0;
      auVar10._12_4_ = auVar93._12_4_ * 0.0;
      auVar31 = blendvps(auVar93,auVar10,auVar37);
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    fVar44 = fVar68 * fVar68 + auVar31._0_4_ * auVar31._0_4_ + auVar31._4_4_ * auVar31._4_4_;
    auVar80 = ZEXT816(0);
    auVar82 = ZEXT816(0);
    if (1e-10 <= fVar44) {
      if (fVar44 < 0.0) {
        local_108 = auVar86;
        local_c8 = auVar31;
        local_b8 = fVar75;
        fStack_b4 = fVar76;
        fStack_b0 = fVar77;
        fStack_ac = fVar78;
        local_a8 = fVar71;
        fStack_a4 = fVar72;
        fStack_a0 = fVar73;
        fStack_9c = fVar74;
        fVar44 = sqrtf(fVar44);
        fVar75 = local_b8;
        fVar76 = fStack_b4;
        fVar77 = fStack_b0;
        fVar78 = fStack_ac;
        auVar86 = local_108;
        auVar31 = local_c8;
        fVar71 = local_a8;
        fVar72 = fStack_a4;
        fVar73 = fStack_a0;
        fVar74 = fStack_9c;
      }
      else {
        fVar44 = SQRT(fVar44);
      }
      fVar44 = 1.0 / fVar44;
      auVar82._4_4_ = auVar31._4_4_ * fVar44;
      auVar82._0_4_ = auVar31._0_4_ * fVar44;
      auVar80 = ZEXT416((uint)(auVar86._0_4_ * fVar44));
      auVar82._8_4_ = auVar31._8_4_ * 0.0;
      auVar82._12_4_ = auVar31._12_4_ * 0.0;
    }
  }
  else {
    auVar80 = ZEXT816(0);
    if (pParams->m_num_pixels == 0) {
      auVar82 = ZEXT816(0);
      local_b8 = fVar75;
      fStack_b4 = fVar76;
      fStack_b0 = fVar77;
      fStack_ac = fVar78;
      local_a8 = fVar71;
      fStack_a4 = fVar72;
      fStack_a0 = fVar73;
      fStack_9c = fVar74;
    }
    else {
      uVar28 = 0;
      auVar31 = auVar80;
      auVar36 = ZEXT816(0);
      local_b8 = fVar75;
      fStack_b4 = fVar76;
      fStack_b0 = fVar77;
      fStack_ac = fVar78;
      local_a8 = fVar71;
      fStack_a4 = fVar72;
      fStack_a0 = fVar73;
      fStack_9c = fVar74;
      do {
        auVar32 = ZEXT216(*(ushort *)pParams->m_pPixels[uVar28].m_c);
        auVar32 = pmovzxbd(auVar32,auVar32);
        auVar33 = ZEXT216(*(ushort *)(pParams->m_pPixels[uVar28].m_c + 2));
        auVar33 = pmovzxbd(auVar33,auVar33);
        fVar62 = (float)auVar32._0_4_ - fVar75;
        fVar64 = (float)auVar32._4_4_ - fVar76;
        fVar66 = (float)auVar32._8_4_ - fVar77;
        fVar68 = (float)auVar32._12_4_ - fVar78;
        auVar83._4_4_ = fVar62;
        auVar83._0_4_ = fVar64;
        auVar83._8_4_ = fVar66;
        auVar83._12_4_ = fVar68;
        fVar44 = (float)auVar33._0_4_ - fVar71;
        fVar49 = (float)auVar33._4_4_ - fVar72;
        fVar59 = (float)auVar33._8_4_ - fVar73;
        fVar60 = (float)auVar33._12_4_ - fVar74;
        auVar34._0_4_ = (uint)(uVar28 == 0) << 0x1f;
        auVar34._4_4_ = (uint)(uVar28 == 0) << 0x1f;
        auVar34._8_8_ = 0;
        auVar88._4_4_ = auVar36._0_4_;
        auVar88._0_4_ = auVar36._4_4_;
        auVar88._8_4_ = auVar36._8_4_;
        auVar88._12_4_ = auVar36._12_4_;
        auVar89 = blendvps(auVar88,auVar83,auVar34);
        auVar5._4_4_ = fVar49;
        auVar5._0_4_ = fVar44;
        auVar5._8_4_ = fVar59;
        auVar5._12_4_ = fVar60;
        auVar32 = blendvps(auVar31,auVar5,auVar34);
        auVar51 = auVar32._0_12_;
        fVar56 = auVar32._4_4_;
        fVar55 = auVar32._12_4_;
        fVar30 = fVar56 * fVar56 +
                 auVar89._0_4_ * auVar89._0_4_ + auVar89._4_4_ * auVar89._4_4_ +
                 auVar32._0_4_ * auVar32._0_4_;
        if ((fVar30 != 0.0) || (NAN(fVar30))) {
          if (fVar30 < 0.0) {
            local_108 = auVar31;
            local_c8 = auVar36;
            local_98 = fVar44;
            fStack_94 = fVar49;
            fStack_90 = fVar59;
            fStack_8c = fVar60;
            local_88 = fVar56;
            fStack_84 = fVar56;
            fStack_80 = fVar55;
            fStack_7c = fVar55;
            local_78 = auVar32;
            local_68 = auVar89;
            local_58 = auVar83;
            local_48 = fVar62;
            fStack_44 = fVar64;
            fStack_40 = fVar66;
            fStack_3c = fVar68;
            fVar30 = sqrtf(fVar30);
            auVar32 = local_78;
            fVar44 = local_98;
            fVar49 = fStack_94;
            fVar59 = fStack_90;
            fVar60 = fStack_8c;
            fVar62 = local_48;
            fVar64 = fStack_44;
            fVar66 = fStack_40;
            fVar68 = fStack_3c;
            fVar75 = local_b8;
            fVar76 = fStack_b4;
            fVar77 = fStack_b0;
            fVar78 = fStack_ac;
            auVar31 = local_108;
            auVar36 = local_c8;
            auVar83 = local_58;
            auVar33 = local_68;
            fVar56 = local_88;
            fVar55 = fStack_80;
            fVar71 = local_a8;
            fVar72 = fStack_a4;
            fVar73 = fStack_a0;
            fVar74 = fStack_9c;
          }
          else {
            fVar30 = SQRT(fVar30);
            auVar33 = auVar89;
          }
          fVar30 = 1.0 / fVar30;
          auVar89._0_4_ = auVar33._0_4_ * fVar30;
          auVar89._4_4_ = auVar33._4_4_ * fVar30;
          auVar89._8_4_ = auVar33._8_4_ * 0.0;
          auVar89._12_4_ = auVar33._12_4_ * 0.0;
          auVar52._4_12_ = auVar32._4_12_;
          auVar52._0_4_ = auVar32._0_4_ * fVar30;
          auVar51 = auVar52._0_12_;
          fVar56 = fVar56 * fVar30;
        }
        fVar30 = fVar62 * auVar83._0_4_;
        fVar43 = fVar66 * auVar83._8_4_;
        auVar84._0_4_ = auVar83._0_4_ * fVar44;
        auVar84._4_4_ = auVar83._4_4_ * fVar49;
        auVar84._8_4_ = auVar83._8_4_ * fVar59;
        auVar84._12_4_ = auVar83._12_4_ * fVar60;
        fVar63 = fVar62 * fVar44;
        fVar65 = fVar64 * fVar49;
        fVar67 = fVar66 * fVar59;
        fVar69 = fVar68 * fVar60;
        auVar35._4_4_ = fVar44 * fVar49;
        auVar35._12_4_ = fVar59 * fVar60;
        fVar87 = auVar89._0_4_;
        fVar90 = auVar89._4_4_;
        fVar91 = auVar89._8_4_;
        fVar92 = auVar89._12_4_;
        auVar39._4_4_ = fVar65;
        auVar39._0_4_ = fVar63;
        auVar39._8_4_ = fVar67;
        auVar39._12_4_ = fVar69;
        auVar32 = insertps(auVar39,auVar84,0x1c);
        fVar50 = auVar51._0_4_;
        fVar54 = auVar51._8_4_;
        auVar45._4_4_ = fVar65;
        auVar45._0_4_ = fVar63;
        auVar45._8_4_ = fVar67;
        auVar45._12_4_ = fVar69;
        auVar33 = insertps(auVar45,auVar84,0x4c);
        auVar82._0_4_ =
             auVar36._0_4_ +
             auVar33._0_4_ * fVar56 +
             auVar32._0_4_ * fVar50 + fVar62 * fVar62 * fVar90 + fVar30 * fVar87;
        auVar82._4_4_ =
             auVar36._4_4_ +
             auVar33._4_4_ * fVar56 +
             auVar32._4_4_ * fVar50 + fVar64 * fVar64 * fVar87 + fVar30 * fVar90;
        auVar82._8_4_ =
             auVar36._8_4_ +
             auVar33._8_4_ * fVar55 +
             auVar32._8_4_ * fVar54 + fVar66 * fVar66 * fVar91 + fVar43 * fVar91;
        auVar82._12_4_ =
             auVar36._12_4_ +
             auVar33._12_4_ * fVar55 +
             auVar32._12_4_ * fVar54 + fVar68 * fVar68 * fVar92 + fVar43 * fVar92;
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar6._4_4_ = fVar49 * fVar49;
        auVar6._0_4_ = fVar44 * fVar44;
        auVar6._8_4_ = fVar59 * fVar59;
        auVar6._12_4_ = fVar60 * fVar60;
        auVar36 = blendps(auVar35,auVar6,2);
        auVar80._0_4_ =
             auVar31._0_4_ +
             auVar36._0_4_ * fVar56 +
             fVar50 * fVar44 * fVar44 + fVar90 * fVar63 + auVar84._0_4_ * fVar87;
        auVar80._4_4_ =
             auVar31._4_4_ +
             auVar36._4_4_ * fVar56 +
             fVar50 * auVar35._4_4_ + fVar87 * fVar65 + auVar84._4_4_ * fVar90;
        auVar80._8_4_ =
             auVar31._8_4_ +
             auVar36._8_4_ * fVar55 +
             fVar54 * fVar59 * fVar59 + fVar91 * fVar67 + auVar84._8_4_ * fVar91;
        auVar80._12_4_ =
             auVar31._12_4_ +
             auVar36._12_4_ * fVar55 +
             fVar54 * auVar35._12_4_ + fVar92 * fVar69 + auVar84._12_4_ * fVar92;
        uVar28 = uVar28 + 1;
        auVar31 = auVar80;
        auVar36 = auVar82;
      } while (uVar28 < pParams->m_num_pixels);
    }
    fVar44 = auVar80._4_4_ * auVar80._4_4_ +
             auVar82._0_4_ * auVar82._0_4_ + auVar82._4_4_ * auVar82._4_4_ +
             auVar80._0_4_ * auVar80._0_4_;
    if ((fVar44 != 0.0) || (NAN(fVar44))) {
      if (fVar44 < 0.0) {
        local_108 = auVar80;
        local_c8 = auVar82;
        fVar44 = sqrtf(fVar44);
        fVar75 = local_b8;
        fVar76 = fStack_b4;
        fVar77 = fStack_b0;
        fVar78 = fStack_ac;
        auVar31 = local_108;
        auVar36 = local_c8;
        fVar71 = local_a8;
        fVar72 = fStack_a4;
        fVar73 = fStack_a0;
        fVar74 = fStack_9c;
      }
      else {
        fVar44 = SQRT(fVar44);
        auVar31 = auVar80;
        auVar36 = auVar82;
      }
      fVar44 = 1.0 / fVar44;
      auVar82._0_4_ = auVar36._0_4_ * fVar44;
      auVar82._4_4_ = auVar36._4_4_ * fVar44;
      auVar82._8_4_ = auVar36._8_4_ * 0.0;
      auVar82._12_4_ = auVar36._12_4_ * 0.0;
      auVar80._0_4_ = auVar31._0_4_ * fVar44;
      auVar80._4_4_ = auVar31._4_4_ * fVar44;
      auVar80._8_4_ = auVar31._8_4_ * 0.0;
      auVar80._12_4_ = auVar31._12_4_ * 0.0;
    }
  }
  auVar40._4_4_ = auVar80._4_4_ * auVar80._4_4_;
  auVar40._12_4_ = auVar80._12_4_ * auVar80._12_4_;
  auVar40._0_4_ = auVar40._4_4_;
  auVar40._8_4_ = auVar40._12_4_;
  auVar41._4_12_ = auVar40._4_12_;
  auVar41._0_4_ =
       auVar40._4_4_ +
       auVar82._0_4_ * auVar82._0_4_ + auVar82._4_4_ * auVar82._4_4_ + auVar80._0_4_ * auVar80._0_4_
  ;
  if (auVar41._0_4_ < 0.5) {
    auVar46[0] = -(pParams->m_perceptual == '\0');
    auVar46[1] = -(pParams->m_has_alpha == '\0');
    auVar46[2] = 0xff;
    auVar46[3] = 0xff;
    auVar46[4] = 0xff;
    auVar46[5] = 0xff;
    auVar46[6] = 0xff;
    auVar46[7] = 0xff;
    auVar46[8] = 0xff;
    auVar46[9] = 0xff;
    auVar46[10] = 0xff;
    auVar46[0xb] = 0xff;
    auVar46[0xc] = 0xff;
    auVar46[0xd] = 0xff;
    auVar46[0xe] = 0xff;
    auVar46[0xf] = 0xff;
    auVar36 = pmovsxbd(auVar41,auVar46);
    auVar31 = pmovsxbq(ZEXT216(CONCAT11(pParams->m_has_alpha,pParams->m_perceptual)),auVar46);
    auVar47._4_4_ = auVar31._0_4_;
    auVar47._0_4_ = auVar31._0_4_;
    auVar47._8_4_ = auVar31._4_4_;
    auVar47._12_4_ = auVar31._4_4_;
    auVar82 = blendvps(ZEXT816(0x3f370a3d3e5a1cac),_DAT_0031cb80,auVar47);
    auVar79._0_12_ = ZEXT812(0x3d9374bc);
    auVar79._12_4_ = 0;
    auVar31 = blendps(auVar79,auVar82,0xe);
    auVar57._0_12_ = ZEXT812(0x3f800000);
    auVar57._12_4_ = 0;
    auVar80 = blendvps(auVar31,auVar57,auVar36);
    auVar31 = blendvps(ZEXT816(0x3f02dfa43d39d4d8),_DAT_0031cb80,auVar47);
    fVar44 = auVar80._4_4_ * auVar80._4_4_ +
             auVar31._0_4_ + auVar31._4_4_ + auVar80._0_4_ * auVar80._0_4_;
    if ((fVar44 != 0.0) || (NAN(fVar44))) {
      if (fVar44 < 0.0) {
        local_108 = auVar80;
        local_c8 = auVar82;
        local_b8 = fVar75;
        fStack_b4 = fVar76;
        fStack_b0 = fVar77;
        fStack_ac = fVar78;
        local_a8 = fVar71;
        fStack_a4 = fVar72;
        fStack_a0 = fVar73;
        fStack_9c = fVar74;
        fVar44 = sqrtf(fVar44);
        fVar75 = local_b8;
        fVar76 = fStack_b4;
        auVar31 = local_108;
        auVar36 = local_c8;
        fVar71 = local_a8;
        fVar72 = fStack_a4;
      }
      else {
        fVar44 = SQRT(fVar44);
        auVar31 = auVar80;
        auVar36 = auVar82;
      }
      fVar44 = 1.0 / fVar44;
      auVar82._0_4_ = auVar36._0_4_ * fVar44;
      auVar82._4_4_ = auVar36._4_4_ * fVar44;
      auVar82._8_4_ = auVar36._8_4_ * 0.0;
      auVar82._12_4_ = auVar36._12_4_ * 0.0;
      auVar80._0_4_ = auVar31._0_4_ * fVar44;
      auVar80._4_4_ = auVar31._4_4_ * fVar44;
      auVar80._8_4_ = auVar31._8_4_ * 0.0;
      auVar80._12_4_ = auVar31._12_4_ * 0.0;
    }
  }
  fVar73 = auVar82._0_4_;
  fVar74 = auVar82._4_4_;
  uVar61 = auVar82._12_4_;
  fVar77 = auVar80._0_4_;
  fVar78 = auVar80._4_4_;
  uVar81 = auVar80._12_4_;
  if ((ulong)pParams->m_num_pixels == 0) {
    fVar44 = 3921568.8;
    fVar49 = -3921568.8;
  }
  else {
    fVar49 = -1e+09;
    fVar44 = 1e+09;
    uVar28 = 0;
    do {
      auVar31 = ZEXT216(*(ushort *)pParams->m_pPixels[uVar28].m_c);
      auVar31 = pmovzxbd(auVar31,auVar31);
      auVar36 = ZEXT216(*(ushort *)(pParams->m_pPixels[uVar28].m_c + 2));
      auVar36 = pmovzxbd(auVar36,auVar36);
      fVar59 = ((float)auVar36._4_4_ - fVar72) * fVar78 +
               ((float)auVar31._0_4_ - fVar75) * fVar73 + ((float)auVar31._4_4_ - fVar76) * fVar74 +
               ((float)auVar36._0_4_ - fVar71) * fVar77;
      if (fVar59 <= fVar44) {
        fVar44 = fVar59;
      }
      if (fVar49 <= fVar59) {
        fVar49 = fVar59;
      }
      uVar28 = uVar28 + 1;
    } while (pParams->m_num_pixels != uVar28);
    fVar44 = fVar44 * 0.003921569;
    fVar49 = fVar49 * 0.003921569;
  }
  fVar76 = fVar73 * fVar44 + local_168;
  fVar75 = fVar74 * fVar44 + local_160;
  auVar58 = ZEXT816(0);
  auVar38 = ZEXT816(0);
  if ((0.0 <= fVar76) &&
     (auVar38._4_4_ = fVar74, auVar38._0_4_ = fVar76, auVar38._8_4_ = auVar82._8_4_,
     auVar38._12_4_ = uVar61, 1.0 < fVar76)) {
    auVar38._0_12_ = ZEXT812(0x3f800000);
    auVar38._12_4_ = 0;
  }
  fVar76 = fVar77 * fVar44 + local_164;
  if ((0.0 <= fVar75) &&
     (auVar58._4_4_ = fVar74, auVar58._0_4_ = fVar75, auVar58._8_4_ = uVar61,
     auVar58._12_4_ = uVar61, 1.0 < fVar75)) {
    auVar58._0_12_ = ZEXT812(0x3f800000);
    auVar58._12_4_ = 0;
  }
  fVar75 = fVar44 * fVar78 + local_14c;
  auVar42._0_12_ = ZEXT812(0);
  auVar42._12_4_ = 0;
  if ((0.0 <= fVar76) &&
     (auVar42._4_4_ = fVar78, auVar42._0_4_ = fVar76, auVar42._8_4_ = auVar80._8_4_,
     auVar42._12_4_ = uVar81, 1.0 < fVar76)) {
    auVar42._0_12_ = ZEXT812(0x3f800000);
    auVar42._12_4_ = 0;
  }
  fVar71 = fVar73 * fVar49 + local_168;
  fVar76 = 0.0;
  if ((0.0 <= fVar75) && (fVar76 = fVar75, 1.0 < fVar75)) {
    fVar76 = 1.0;
  }
  fVar75 = fVar74 * fVar49 + local_160;
  auVar48._0_12_ = ZEXT812(0);
  auVar48._12_4_ = 0;
  if ((0.0 <= fVar71) &&
     (auVar48._4_4_ = fVar74, auVar48._0_4_ = fVar71, auVar48._8_4_ = auVar82._8_4_,
     auVar48._12_4_ = uVar61, 1.0 < fVar71)) {
    auVar48._0_12_ = ZEXT812(0x3f800000);
    auVar48._12_4_ = 0;
  }
  fVar72 = fVar77 * fVar49 + local_164;
  fVar77 = 0.0;
  fVar71 = 0.0;
  uVar70 = 0;
  if ((0.0 <= fVar75) && (fVar77 = fVar75, fVar71 = fVar74, uVar70 = uVar61, 1.0 < fVar75)) {
    fVar77 = 1.0;
    fVar71 = 0.0;
    uVar70 = 0;
  }
  fVar75 = fVar78 * fVar49 + local_14c;
  auVar53 = ZEXT816(0);
  if ((0.0 <= fVar72) &&
     (auVar53._4_4_ = fVar78, auVar53._0_4_ = fVar72, auVar53._8_4_ = auVar80._8_4_,
     auVar53._12_4_ = uVar81, 1.0 < fVar72)) {
    auVar53._0_12_ = ZEXT812(0x3f800000);
    auVar53._12_4_ = 0;
  }
  fVar72 = 0.0;
  fVar73 = 0.0;
  uVar61 = 0;
  if ((0.0 <= fVar75) && (fVar72 = fVar75, fVar73 = fVar78, uVar61 = uVar81, 1.0 < fVar75)) {
    fVar72 = 1.0;
    fVar73 = 0.0;
    uVar61 = 0;
  }
  auVar31 = insertps(auVar38,auVar48,0x10);
  auVar11._4_4_ = fVar71;
  auVar11._0_4_ = fVar77;
  auVar11._8_4_ = uVar70;
  auVar11._12_4_ = uVar70;
  auVar32 = insertps(auVar58,auVar11,0x10);
  auVar36 = insertps(auVar42,auVar53,0x10);
  auVar7._4_4_ = fVar73;
  auVar7._0_4_ = fVar72;
  auVar7._8_4_ = uVar61;
  auVar7._12_4_ = uVar61;
  auVar33 = insertps(ZEXT416((uint)fVar76),auVar7,0x10);
  if (auVar33._0_4_ + auVar36._0_4_ + auVar32._0_4_ + auVar31._0_4_ <=
      auVar33._4_4_ + auVar36._4_4_ + auVar32._4_4_ + auVar31._4_4_) {
    auVar36 = insertps(auVar38,auVar58,0x10);
    auVar33 = insertps(auVar42,ZEXT416((uint)fVar76),0x10);
    auVar13._4_4_ = fVar71;
    auVar13._0_4_ = fVar77;
    auVar13._8_4_ = uVar70;
    auVar13._12_4_ = uVar70;
    auVar31 = insertps(auVar48,auVar13,0x10);
    auVar9._4_4_ = fVar73;
    auVar9._0_4_ = fVar72;
    auVar9._8_4_ = uVar61;
    auVar9._12_4_ = uVar61;
    auVar32 = insertps(auVar53,auVar9,0x10);
  }
  else {
    auVar12._4_4_ = fVar71;
    auVar12._0_4_ = fVar77;
    auVar12._8_4_ = uVar70;
    auVar12._12_4_ = uVar70;
    auVar36 = insertps(auVar48,auVar12,0x10);
    auVar31 = insertps(auVar38,auVar58,0x10);
    auVar8._4_4_ = fVar73;
    auVar8._0_4_ = fVar72;
    auVar8._8_4_ = uVar61;
    auVar8._12_4_ = uVar61;
    auVar33 = insertps(auVar53,auVar8,0x10);
    auVar32 = insertps(auVar42,ZEXT416((uint)fVar76),0x10);
  }
  xl.m_c._0_8_ = auVar36._0_8_;
  xl.m_c._8_8_ = auVar33._0_8_;
  xh.m_c._0_8_ = auVar31._0_8_;
  xh.m_c._8_8_ = auVar32._0_8_;
  uVar18 = find_optimal_solution(local_150,xl,xh,pParams,pResults);
  if (uVar18 == 0) {
    return 0;
  }
  if (local_110->m_least_squares_passes != 0) {
    uVar23 = 0;
    do {
      local_f8.m_best_overall_err = 0;
      local_f8.m_low_endpoint.m_c[0] = '\0';
      local_f8.m_low_endpoint.m_c[1] = '\0';
      local_f8.m_low_endpoint.m_c[2] = '\0';
      local_f8.m_low_endpoint.m_c[3] = '\0';
      local_f8.m_high_endpoint.m_c[0] = '\0';
      local_f8.m_high_endpoint.m_c[1] = '\0';
      local_f8.m_high_endpoint.m_c[2] = '\0';
      local_f8.m_high_endpoint.m_c[3] = '\0';
      local_128.m_c[0] = 0.0;
      local_128.m_c[1] = 0.0;
      local_128.m_c[2] = 0.0;
      local_128.m_c[3] = 0.0;
      if (pParams->m_has_alpha == '\0') {
        compute_least_squares_endpoints_rgb
                  (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                   (bc7enc_vec4F *)&local_f8,&local_128,pParams->m_pPixels);
      }
      else {
        compute_least_squares_endpoints_rgba
                  (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                   (bc7enc_vec4F *)&local_f8,&local_128,pParams->m_pPixels);
      }
      xl_00.m_c._0_8_ =
           CONCAT44((float)(local_f8.m_best_overall_err >> 0x20) * 0.003921569,
                    (float)local_f8.m_best_overall_err * 0.003921569);
      cVar14.m_c = local_f8.m_high_endpoint.m_c;
      local_f8.m_low_endpoint.m_c = (uint8_t  [4])(local_f8.m_low_endpoint.m_c * 0.003921569);
      local_f8.m_high_endpoint.m_c = (uint8_t  [4])(cVar14.m_c * 0.003921569);
      fVar75 = local_128.m_c[1];
      local_128.m_c[0] = local_128.m_c[0] * 0.003921569;
      local_128.m_c[1] = fVar75 * 0.003921569;
      fVar75 = local_128.m_c[3];
      local_128.m_c[2] = local_128.m_c[2] * 0.003921569;
      local_128.m_c[3] = fVar75 * 0.003921569;
      xl_00.m_c[2] = (float)local_f8.m_low_endpoint.m_c;
      xl_00.m_c[3] = (float)local_f8.m_high_endpoint.m_c;
      xh_00.m_c[2] = local_128.m_c[2];
      xh_00.m_c[3] = local_128.m_c[3];
      xh_00.m_c[0] = local_128.m_c[0];
      xh_00.m_c[1] = local_128.m_c[1];
      local_f8.m_best_overall_err = xl_00.m_c._0_8_;
      uVar18 = find_optimal_solution(local_150,xl_00,xh_00,pParams,pResults);
      if (uVar18 == 0) {
        return 0;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < local_110->m_least_squares_passes);
  }
  if ((pParams->m_pForce_selectors == (uint8_t *)0x0) && (local_110->m_uber_level != 0)) {
    uVar23 = pParams->m_num_pixels;
    uVar28 = (ulong)uVar23;
    memcpy(&local_f8,pResults->m_pSelectors,uVar28);
    auVar31 = local_108;
    local_108._4_4_ = 0;
    local_108._0_4_ = pParams->m_num_selector_weights;
    if (uVar28 == 0) {
      uVar19 = 0;
      uVar26 = 0x100;
    }
    else {
      uVar22 = 0;
      uVar26 = 0x100;
      uVar19 = 0;
      do {
        bVar2 = *(byte *)((long)&((color_cell_compressor_results *)(&local_f8.m_low_endpoint + -2))
                                 ->m_best_overall_err + uVar22);
        if (bVar2 <= uVar26) {
          uVar26 = (uint)bVar2;
        }
        uVar24 = (uint)bVar2;
        if (bVar2 < uVar19) {
          uVar24 = uVar19;
        }
        uVar19 = uVar24;
        uVar22 = uVar22 + 1;
      } while (uVar28 != uVar22);
    }
    local_108._8_8_ = auVar31._8_8_;
    uVar24 = pParams->m_num_selector_weights - 1;
    if (uVar28 != 0) {
      uVar22 = 0;
      do {
        bVar2 = *(byte *)((long)&((color_cell_compressor_results *)(&local_f8.m_low_endpoint + -2))
                                 ->m_best_overall_err + uVar22);
        *(byte *)((long)local_128.m_c + uVar22) =
             bVar2 + ((bVar2 <= uVar24 && uVar24 != bVar2) && uVar26 == bVar2);
        uVar22 = uVar22 + 1;
      } while (uVar28 != uVar22);
    }
    local_138.m_c[0] = 0.0;
    local_138.m_c[1] = 0.0;
    local_138.m_c[2] = 0.0;
    local_138.m_c[3] = 0.0;
    local_148.m_c[0] = 0.0;
    local_148.m_c[1] = 0.0;
    local_148.m_c[2] = 0.0;
    local_148.m_c[3] = 0.0;
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar23,(uint8_t *)&local_128,pParams->m_pSelector_weightsx,&local_138,&local_148,
                 pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar23,(uint8_t *)&local_128,pParams->m_pSelector_weightsx,&local_138,&local_148,
                 pParams->m_pPixels);
    }
    fVar75 = local_138.m_c[1];
    local_138.m_c[0] = local_138.m_c[0] * 0.003921569;
    local_138.m_c[1] = fVar75 * 0.003921569;
    fVar75 = local_138.m_c[3];
    local_138.m_c[2] = local_138.m_c[2] * 0.003921569;
    local_138.m_c[3] = fVar75 * 0.003921569;
    fVar75 = local_148.m_c[1];
    local_148.m_c[0] = local_148.m_c[0] * 0.003921569;
    local_148.m_c[1] = fVar75 * 0.003921569;
    fVar75 = local_148.m_c[3];
    local_148.m_c[2] = local_148.m_c[2] * 0.003921569;
    local_148.m_c[3] = fVar75 * 0.003921569;
    xl_01.m_c[2] = local_138.m_c[2];
    xl_01.m_c[3] = local_138.m_c[3];
    xl_01.m_c[0] = local_138.m_c[0];
    xl_01.m_c[1] = local_138.m_c[1];
    xh_01.m_c[2] = local_148.m_c[2];
    xh_01.m_c[3] = local_148.m_c[3];
    xh_01.m_c[0] = local_148.m_c[0];
    xh_01.m_c[1] = local_148.m_c[1];
    uVar18 = find_optimal_solution(local_150,xl_01,xh_01,pParams,pResults);
    if (uVar18 == 0) {
      return 0;
    }
    uVar23 = pParams->m_num_pixels;
    if ((ulong)uVar23 != 0) {
      uVar28 = 0;
      do {
        bVar2 = *(byte *)((long)&((color_cell_compressor_results *)(&local_f8.m_low_endpoint + -2))
                                 ->m_best_overall_err + uVar28);
        *(byte *)((long)local_128.m_c + uVar28) = bVar2 - (uVar19 == bVar2 && bVar2 != 0);
        uVar28 = uVar28 + 1;
      } while (uVar23 != uVar28);
    }
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar23,(uint8_t *)&local_128,pParams->m_pSelector_weightsx,&local_138,&local_148,
                 pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar23,(uint8_t *)&local_128,pParams->m_pSelector_weightsx,&local_138,&local_148,
                 pParams->m_pPixels);
    }
    fVar75 = local_138.m_c[1];
    local_138.m_c[0] = local_138.m_c[0] * 0.003921569;
    local_138.m_c[1] = fVar75 * 0.003921569;
    fVar75 = local_138.m_c[3];
    local_138.m_c[2] = local_138.m_c[2] * 0.003921569;
    local_138.m_c[3] = fVar75 * 0.003921569;
    fVar75 = local_148.m_c[1];
    local_148.m_c[0] = local_148.m_c[0] * 0.003921569;
    local_148.m_c[1] = fVar75 * 0.003921569;
    fVar75 = local_148.m_c[3];
    local_148.m_c[2] = local_148.m_c[2] * 0.003921569;
    local_148.m_c[3] = fVar75 * 0.003921569;
    xl_02.m_c[2] = local_138.m_c[2];
    xl_02.m_c[3] = local_138.m_c[3];
    xl_02.m_c[0] = local_138.m_c[0];
    xl_02.m_c[1] = local_138.m_c[1];
    xh_02.m_c[2] = local_148.m_c[2];
    xh_02.m_c[3] = local_148.m_c[3];
    xh_02.m_c[0] = local_148.m_c[0];
    xh_02.m_c[1] = local_148.m_c[1];
    uVar18 = find_optimal_solution(local_150,xl_02,xh_02,pParams,pResults);
    if (uVar18 == 0) {
      return 0;
    }
    uVar23 = pParams->m_num_pixels;
    if ((ulong)uVar23 != 0) {
      uVar28 = 0;
      do {
        bVar2 = *(byte *)((long)&((color_cell_compressor_results *)(&local_f8.m_low_endpoint + -2))
                                 ->m_best_overall_err + uVar28);
        uVar20 = (uint)bVar2;
        if ((uVar26 != bVar2) ||
           (uVar25 = pParams->m_num_selector_weights - 1, cVar21 = '\x01',
           uVar25 < bVar2 || uVar25 == uVar20)) {
          cVar21 = -(uVar20 != 0 && uVar19 == uVar20);
        }
        *(byte *)((long)local_128.m_c + uVar28) = bVar2 + cVar21;
        uVar28 = uVar28 + 1;
      } while (uVar23 != uVar28);
    }
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar23,(uint8_t *)&local_128,pParams->m_pSelector_weightsx,&local_138,&local_148,
                 pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar23,(uint8_t *)&local_128,pParams->m_pSelector_weightsx,&local_138,&local_148,
                 pParams->m_pPixels);
    }
    fVar75 = local_138.m_c[1];
    local_138.m_c[0] = local_138.m_c[0] * 0.003921569;
    local_138.m_c[1] = fVar75 * 0.003921569;
    fVar75 = local_138.m_c[3];
    local_138.m_c[2] = local_138.m_c[2] * 0.003921569;
    local_138.m_c[3] = fVar75 * 0.003921569;
    fVar75 = local_148.m_c[1];
    local_148.m_c[0] = local_148.m_c[0] * 0.003921569;
    local_148.m_c[1] = fVar75 * 0.003921569;
    fVar75 = local_148.m_c[3];
    local_148.m_c[2] = local_148.m_c[2] * 0.003921569;
    local_148.m_c[3] = fVar75 * 0.003921569;
    xl_03.m_c[2] = local_138.m_c[2];
    xl_03.m_c[3] = local_138.m_c[3];
    xl_03.m_c[0] = local_138.m_c[0];
    xl_03.m_c[1] = local_138.m_c[1];
    xh_03.m_c[2] = local_148.m_c[2];
    xh_03.m_c[3] = local_148.m_c[3];
    xh_03.m_c[0] = local_148.m_c[0];
    xh_03.m_c[1] = local_148.m_c[1];
    uVar18 = find_optimal_solution(local_150,xl_03,xh_03,pParams,pResults);
    if (uVar18 == 0) {
      return 0;
    }
    uVar23 = local_110->m_uber_level;
    if ((1 < uVar23) && ((ulong)(pParams->m_num_pixels * 0x38 >> 4) < pResults->m_best_overall_err))
    {
      iVar17 = 1;
      if (3 < uVar23) {
        iVar17 = uVar23 - 2;
      }
      if (-2 < iVar17) {
        iVar27 = -iVar17;
        iVar15 = local_108._0_4_;
        local_110 = (bc7enc_compress_block_params *)CONCAT44(local_110._4_4_,iVar15 + -2);
        fVar75 = (float)(int)uVar24;
        uVar26 = 3;
        if (3 < uVar23) {
          uVar26 = uVar23;
        }
        local_98 = (float)(iVar17 + uVar24);
        local_c8._0_4_ = fVar75;
        do {
          if ((int)(uint)local_110 <= (int)local_98) {
            fVar76 = (float)iVar27;
            local_108._0_4_ = fVar76;
            uVar23 = (uint)local_110;
            do {
              if (uVar23 != uVar24 || iVar27 != 0) {
                uVar19 = pParams->m_num_pixels;
                if ((ulong)uVar19 != 0) {
                  uVar28 = 0;
                  do {
                    auVar31 = roundss(ZEXT816(0),
                                      ZEXT416((uint)((((float)*(byte *)((long)&((
                                                  color_cell_compressor_results *)
                                                  (&local_f8.m_low_endpoint + -2))->
                                                  m_best_overall_err + uVar28) - fVar76) * fVar75) /
                                                  ((float)(int)uVar23 - fVar76) + 0.5)),9);
                    fVar78 = auVar31._0_4_;
                    fVar77 = 0.0;
                    if ((0.0 <= fVar78) && (fVar77 = fVar78, fVar75 < fVar78)) {
                      fVar77 = fVar75;
                    }
                    *(char *)((long)local_128.m_c + uVar28) = (char)(int)fVar77;
                    uVar28 = uVar28 + 1;
                  } while (uVar19 != uVar28);
                }
                local_138.m_c[0] = 0.0;
                local_138.m_c[1] = 0.0;
                local_138.m_c[2] = 0.0;
                local_138.m_c[3] = 0.0;
                local_148.m_c[0] = 0.0;
                local_148.m_c[1] = 0.0;
                local_148.m_c[2] = 0.0;
                local_148.m_c[3] = 0.0;
                if (pParams->m_has_alpha == '\0') {
                  compute_least_squares_endpoints_rgb
                            (uVar19,(uint8_t *)&local_128,pParams->m_pSelector_weightsx,&local_138,
                             &local_148,pParams->m_pPixels);
                }
                else {
                  compute_least_squares_endpoints_rgba
                            (uVar19,(uint8_t *)&local_128,pParams->m_pSelector_weightsx,&local_138,
                             &local_148,pParams->m_pPixels);
                }
                fVar75 = local_138.m_c[1];
                local_138.m_c[0] = local_138.m_c[0] * 0.003921569;
                local_138.m_c[1] = fVar75 * 0.003921569;
                fVar75 = local_138.m_c[3];
                local_138.m_c[2] = local_138.m_c[2] * 0.003921569;
                local_138.m_c[3] = fVar75 * 0.003921569;
                fVar75 = local_148.m_c[1];
                local_148.m_c[0] = local_148.m_c[0] * 0.003921569;
                local_148.m_c[1] = fVar75 * 0.003921569;
                fVar75 = local_148.m_c[3];
                local_148.m_c[2] = local_148.m_c[2] * 0.003921569;
                local_148.m_c[3] = fVar75 * 0.003921569;
                xl_04.m_c[2] = local_138.m_c[2];
                xl_04.m_c[3] = local_138.m_c[3];
                xl_04.m_c[0] = local_138.m_c[0];
                xl_04.m_c[1] = local_138.m_c[1];
                xh_04.m_c[2] = local_148.m_c[2];
                xh_04.m_c[3] = local_148.m_c[3];
                xh_04.m_c[0] = local_148.m_c[0];
                xh_04.m_c[1] = local_148.m_c[1];
                uVar18 = find_optimal_solution(local_150,xl_04,xh_04,pParams,pResults);
                fVar76 = (float)local_108._0_4_;
                fVar75 = (float)local_c8._0_4_;
                if (uVar18 == 0) {
                  return 0;
                }
              }
              bVar29 = uVar23 != (iVar15 + uVar26) - 3;
              uVar23 = uVar23 + 1;
            } while (bVar29);
          }
          iVar27 = iVar27 + 1;
        } while (iVar27 != 2);
      }
    }
  }
  if (pParams->m_pForce_selectors != (uint8_t *)0x0) goto LAB_0020e563;
  if (local_150 == 1) {
    local_f8.m_best_overall_err = pResults->m_best_overall_err;
    local_f8.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
    local_f8.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
    local_f8.m_pbits = *&pResults->m_pbits;
    local_f8.m_pSelectors = pResults->m_pSelectors;
    local_f8.m_pSelectors_temp = pResults->m_pSelectors_temp;
    local_f8.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
    local_f8.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
    uVar28 = pack_mode1_to_one_color
                       (pParams,&local_f8,(int)(local_168 * 255.0 + 0.5),
                        (int)(local_160 * 255.0 + 0.5),(int)(local_164 * 255.0 + 0.5),
                        pResults->m_pSelectors_temp);
  }
  else {
    uVar3 = pParams->m_astc_endpoint_range;
    if (((uVar3 == 8) && (pParams->m_num_selector_weights == 8)) && (pParams->m_has_alpha == '\0'))
    {
      local_f8.m_best_overall_err = pResults->m_best_overall_err;
      local_f8.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
      local_f8.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
      local_f8.m_pbits = *&pResults->m_pbits;
      local_f8.m_pSelectors = pResults->m_pSelectors;
      local_f8.m_pSelectors_temp = pResults->m_pSelectors_temp;
      local_f8.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      local_f8.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar28 = pack_astc_4bit_3bit_to_one_color
                         (pParams,&local_f8,(int)(local_168 * 255.0 + 0.5),
                          (int)(local_160 * 255.0 + 0.5),(int)(local_164 * 255.0 + 0.5),
                          pResults->m_pSelectors_temp);
    }
    else if (((uVar3 == 7) && (pParams->m_num_selector_weights == 4)) &&
            (pParams->m_has_alpha == '\0')) {
      local_f8.m_best_overall_err = pResults->m_best_overall_err;
      local_f8.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
      local_f8.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
      local_f8.m_pbits = *&pResults->m_pbits;
      local_f8.m_pSelectors = pResults->m_pSelectors;
      local_f8.m_pSelectors_temp = pResults->m_pSelectors_temp;
      local_f8.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      local_f8.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar28 = pack_astc_range7_2bit_to_one_color
                         (pParams,&local_f8,(int)(local_168 * 255.0 + 0.5),
                          (int)(local_160 * 255.0 + 0.5),(int)(local_164 * 255.0 + 0.5),
                          pResults->m_pSelectors_temp);
    }
    else if (((uVar3 == 8) && (pParams->m_num_selector_weights == 4)) &&
            (pParams->m_has_alpha != '\0')) {
      local_f8.m_best_overall_err = pResults->m_best_overall_err;
      local_f8.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
      local_f8.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
      local_f8.m_pbits = *&pResults->m_pbits;
      local_f8.m_pSelectors = pResults->m_pSelectors;
      local_f8.m_pSelectors_temp = pResults->m_pSelectors_temp;
      local_f8.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      local_f8.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar28 = pack_astc_4bit_2bit_to_one_color_rgba
                         (pParams,&local_f8,(int)(local_168 * 255.0 + 0.5),
                          (int)(local_160 * 255.0 + 0.5),(int)(local_164 * 255.0 + 0.5),
                          (int)(local_14c * 255.0 + 0.5),pResults->m_pSelectors_temp);
    }
    else if (uVar3 == 0xb) {
      if ((pParams->m_num_selector_weights != 0x20) || (pParams->m_has_alpha != '\0'))
      goto LAB_0020e563;
      local_f8.m_best_overall_err = pResults->m_best_overall_err;
      local_f8.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
      local_f8.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
      local_f8.m_pbits = *&pResults->m_pbits;
      local_f8.m_pSelectors = pResults->m_pSelectors;
      local_f8.m_pSelectors_temp = pResults->m_pSelectors_temp;
      local_f8.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      local_f8.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar28 = pack_astc_range11_5bit_to_one_color
                         (pParams,&local_f8,(int)(local_168 * 255.0 + 0.5),
                          (int)(local_160 * 255.0 + 0.5),(int)(local_164 * 255.0 + 0.5),
                          pResults->m_pSelectors_temp);
    }
    else {
      if (((uVar3 != 0xd) || (pParams->m_num_selector_weights != 4)) ||
         (pParams->m_has_alpha != '\0')) goto LAB_0020e563;
      local_f8.m_best_overall_err = pResults->m_best_overall_err;
      local_f8.m_low_endpoint.m_c = (pResults->m_low_endpoint).m_c[0];
      local_f8.m_high_endpoint.m_c = (pResults->m_high_endpoint).m_c[0];
      local_f8.m_pbits = *&pResults->m_pbits;
      local_f8.m_pSelectors = pResults->m_pSelectors;
      local_f8.m_pSelectors_temp = pResults->m_pSelectors_temp;
      local_f8.m_astc_low_endpoint.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      local_f8.m_astc_high_endpoint.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar28 = pack_astc_range13_2bit_to_one_color
                         (pParams,&local_f8,(int)(local_168 * 255.0 + 0.5),
                          (int)(local_160 * 255.0 + 0.5),(int)(local_164 * 255.0 + 0.5),
                          pResults->m_pSelectors_temp);
    }
  }
  if (uVar28 < pResults->m_best_overall_err) {
    *&pResults->m_pbits = local_f8.m_pbits;
    pResults->m_pSelectors = local_f8.m_pSelectors;
    pResults->m_pSelectors_temp = local_f8.m_pSelectors_temp;
    pResults->m_astc_low_endpoint = (color_quad_u8)local_f8.m_astc_low_endpoint.m_c;
    pResults->m_astc_high_endpoint = (color_quad_u8)local_f8.m_astc_high_endpoint.m_c;
    pResults->m_best_overall_err = local_f8.m_best_overall_err;
    pResults->m_low_endpoint = (color_quad_u8)local_f8.m_low_endpoint.m_c;
    pResults->m_high_endpoint = (color_quad_u8)local_f8.m_high_endpoint.m_c;
    memcpy(pResults->m_pSelectors,pResults->m_pSelectors_temp,(ulong)pParams->m_num_pixels);
    pResults->m_best_overall_err = uVar28;
  }
LAB_0020e563:
  return pResults->m_best_overall_err;
}

Assistant:

uint64_t color_cell_compression(uint32_t mode, const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, const bc7enc_compress_block_params *pComp_params)
{
	if (!pParams->m_astc_endpoint_range)
	{
		assert((mode == 6) || (!pParams->m_has_alpha));
	}
	assert(pParams->m_num_selector_weights >= 1 && pParams->m_num_selector_weights <= 32);
	assert(pParams->m_pSelector_weights[0] == 0);
	assert(pParams->m_pSelector_weights[pParams->m_num_selector_weights - 1] == 64);

	pResults->m_best_overall_err = UINT64_MAX;

	uint32_t cr, cg, cb, ca;

	// If the partition's colors are all the same, then just pack them as a single color.
	if (!pParams->m_pForce_selectors)
	{
		if (mode == 1)
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_mode1_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 8) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_4bit_3bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range7_2bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha))
		{
			if (is_solid_rgba(pParams, cr, cg, cb, ca))
				return pack_astc_4bit_2bit_to_one_color_rgba(pParams, pResults, cr, cg, cb, ca, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 13) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range13_2bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 11) && (pParams->m_num_selector_weights == 32) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range11_5bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
	}

	// Compute partition's mean color and principle axis.
	bc7enc_vec4F meanColor, axis;
	vec4F_set_scalar(&meanColor, 0.0f);

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
		meanColor = vec4F_add(&meanColor, &color);
	}
				
	bc7enc_vec4F meanColorScaled = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels));

	meanColor = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels * 255.0f));
	vec4F_saturate_in_place(&meanColor);
	
	if (pParams->m_has_alpha)
	{
		// Use incremental PCA for RGBA PCA, because it's simple.
		vec4F_set_scalar(&axis, 0.0f);
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
			color = vec4F_sub(&color, &meanColorScaled);
			bc7enc_vec4F a = vec4F_mul(&color, color.m_c[0]);
			bc7enc_vec4F b = vec4F_mul(&color, color.m_c[1]);
			bc7enc_vec4F c = vec4F_mul(&color, color.m_c[2]);
			bc7enc_vec4F d = vec4F_mul(&color, color.m_c[3]);
			bc7enc_vec4F n = i ? axis : color;
			vec4F_normalize_in_place(&n);
			axis.m_c[0] += vec4F_dot(&a, &n);
			axis.m_c[1] += vec4F_dot(&b, &n);
			axis.m_c[2] += vec4F_dot(&c, &n);
			axis.m_c[3] += vec4F_dot(&d, &n);
		}
		vec4F_normalize_in_place(&axis);
	}
	else
	{
		// Use covar technique for RGB PCA, because it doesn't require per-pixel normalization.
		float cov[6] = { 0, 0, 0, 0, 0, 0 };

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			const color_quad_u8 *pV = &pParams->m_pPixels[i];
			float r = pV->m_c[0] - meanColorScaled.m_c[0];
			float g = pV->m_c[1] - meanColorScaled.m_c[1];
			float b = pV->m_c[2] - meanColorScaled.m_c[2];
			cov[0] += r*r; cov[1] += r*g; cov[2] += r*b; cov[3] += g*g; cov[4] += g*b; cov[5] += b*b;
		}

		float xr = .9f, xg = 1.0f, xb = .7f;
		for (uint32_t iter = 0; iter < 3; iter++)
		{
			float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
			float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
			float b = xr * cov[2] + xg * cov[4] + xb * cov[5];

			float m = maximumf(maximumf(fabsf(r), fabsf(g)), fabsf(b));
			if (m > 1e-10f)
			{
				m = 1.0f / m;
				r *= m; g *= m; b *= m;
			}

			xr = r; xg = g; xb = b;
		}

		float len = xr * xr + xg * xg + xb * xb;
		if (len < 1e-10f)
			vec4F_set_scalar(&axis, 0.0f);
		else
		{
			len = 1.0f / sqrtf(len);
			xr *= len; xg *= len; xb *= len;
			vec4F_set(&axis, xr, xg, xb, 0);
		}
	}
				
	if (vec4F_dot(&axis, &axis) < .5f)
	{
		if (pParams->m_perceptual)
			vec4F_set(&axis, .213f, .715f, .072f, pParams->m_has_alpha ? .715f : 0);
		else
			vec4F_set(&axis, 1.0f, 1.0f, 1.0f, pParams->m_has_alpha ? 1.0f : 0);
		vec4F_normalize_in_place(&axis);
	}
			
	bc7enc_vec4F minColor, maxColor;

	float l = 1e+9f, h = -1e+9f;

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);

		bc7enc_vec4F q = vec4F_sub(&color, &meanColorScaled);
		float d = vec4F_dot(&q, &axis);

		l = minimumf(l, d);
		h = maximumf(h, d);
	}

	l *= (1.0f / 255.0f);
	h *= (1.0f / 255.0f);

	bc7enc_vec4F b0 = vec4F_mul(&axis, l);
	bc7enc_vec4F b1 = vec4F_mul(&axis, h);
	bc7enc_vec4F c0 = vec4F_add(&meanColor, &b0);
	bc7enc_vec4F c1 = vec4F_add(&meanColor, &b1);
	minColor = vec4F_saturate(&c0);
	maxColor = vec4F_saturate(&c1);
				
	bc7enc_vec4F whiteVec;
	vec4F_set_scalar(&whiteVec, 1.0f);
	if (vec4F_dot(&minColor, &whiteVec) > vec4F_dot(&maxColor, &whiteVec))
	{
#if 1
		std::swap(minColor.m_c[0], maxColor.m_c[0]);
		std::swap(minColor.m_c[1], maxColor.m_c[1]);
		std::swap(minColor.m_c[2], maxColor.m_c[2]);
		std::swap(minColor.m_c[3], maxColor.m_c[3]);
#elif 0
		// Fails to compile correctly with MSVC 2019 (code generation bug)
		std::swap(minColor, maxColor);
#else
		// Fails with MSVC 2019
		bc7enc_vec4F temp = minColor;
		minColor = maxColor;
		maxColor = temp;
#endif
	}

	// First find a solution using the block's PCA.
	if (!find_optimal_solution(mode, minColor, maxColor, pParams, pResults))
		return 0;
	
	for (uint32_t i = 0; i < pComp_params->m_least_squares_passes; i++)
	{
		// Now try to refine the solution using least squares by computing the optimal endpoints from the current selectors.
		bc7enc_vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;
	}
	
	if ((!pParams->m_pForce_selectors) && (pComp_params->m_uber_level > 0))
	{
		// In uber level 1, try varying the selectors a little, somewhat like cluster fit would. First try incrementing the minimum selectors,
		// then try decrementing the selectrors, then try both.
		uint8_t selectors_temp[16], selectors_temp1[16];
		memcpy(selectors_temp, pResults->m_pSelectors, pParams->m_num_pixels);

		const int max_selector = pParams->m_num_selector_weights - 1;

		uint32_t min_sel = 256;
		uint32_t max_sel = 0;
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			min_sel = minimumu(min_sel, sel);
			max_sel = maximumu(max_sel, sel);
		}

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			selectors_temp1[i] = (uint8_t)sel;
		}

		bc7enc_vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			else if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		// In uber levels 2+, try taking more advantage of endpoint extrapolation by scaling the selectors in one direction or another.
		const uint32_t uber_err_thresh = (pParams->m_num_pixels * 56) >> 4;
		if ((pComp_params->m_uber_level >= 2) && (pResults->m_best_overall_err > uber_err_thresh))
		{
			const int Q = (pComp_params->m_uber_level >= 4) ? (pComp_params->m_uber_level - 2) : 1;
			for (int ly = -Q; ly <= 1; ly++)
			{
				for (int hy = max_selector - 1; hy <= (max_selector + Q); hy++)
				{
					if ((ly == 0) && (hy == max_selector))
						continue;

					for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
						selectors_temp1[i] = (uint8_t)clampf(floorf((float)max_selector * ((float)selectors_temp[i] - (float)ly) / ((float)hy - (float)ly) + .5f), 0, (float)max_selector);

					//bc7enc_vec4F xl, xh;
					vec4F_set_scalar(&xl, 0.0f);
					vec4F_set_scalar(&xh, 0.0f);
					if (pParams->m_has_alpha)
						compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
					else
						compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

					xl = vec4F_mul(&xl, (1.0f / 255.0f));
					xh = vec4F_mul(&xh, (1.0f / 255.0f));

					if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
						return 0;
				}
			}
		}
	}
	
	if (!pParams->m_pForce_selectors)
	{
		// Try encoding the partition as a single color by using the optimal single colors tables to encode the block to its mean.
		if (mode == 1)
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_mode1_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 8) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_4bit_3bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range7_2bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f), a = (int)(.5f + meanColor.m_c[3] * 255.0f);
			uint64_t avg_err = pack_astc_4bit_2bit_to_one_color_rgba(pParams, &avg_results, r, g, b, a, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 13) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range13_2bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 11) && (pParams->m_num_selector_weights == 32) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range11_5bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
	}

#if BC7ENC_CHECK_OVERALL_ERROR
	check_best_overall_error(pParams, pResults);
#endif
		
	return pResults->m_best_overall_err;
}